

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O3

string * __thiscall
deqp::egl::(anonymous_namespace)::createTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int threads,
          int perThreadContextCount)

{
  ostream *poVar1;
  string *psVar2;
  char *pcVar3;
  int iVar4;
  ostringstream stream;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  iVar4 = (int)this;
  poVar1 = (ostream *)std::ostream::operator<<(aoStack_198,iVar4);
  pcVar3 = "_threads_";
  if (iVar4 == 1) {
    pcVar3 = "_thread_";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,(ulong)(iVar4 == 1) ^ 9);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,threads);
  pcVar3 = "_contexts";
  if (threads == 1) {
    pcVar3 = "_context";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,(ulong)(threads == 1) ^ 9);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  psVar2 = (string *)std::ios_base::~ios_base(local_128);
  return psVar2;
}

Assistant:

string createTestName(int threads, int perThreadContextCount)
{
	std::ostringstream stream;

	stream << threads << (threads == 1 ? "_thread_" : "_threads_") << perThreadContextCount << (perThreadContextCount == 1 ? "_context" : "_contexts");

	return stream.str();
}